

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battle_check.cpp
# Opt level: O2

void dragon_death_check(int hp)

{
  ostream *poVar1;
  allocator local_51;
  string local_50;
  string local_30;
  
  if (0 < hp) {
    return;
  }
  local_50._M_dataplus._M_p = (pointer)0x2bc;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&local_50);
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::string((string *)&local_30,anon_var_dwarf_133c9,&local_51);
  red_text(&local_50,&local_30);
  std::operator<<(poVar1,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  local_50._M_dataplus._M_p = (pointer)0x12c;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&local_50);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  pause();
  exit(0);
}

Assistant:

void dragon_death_check(int hp){
	if(hp<=0)
    {
        this_thread::sleep_for(chrono::milliseconds(700));
        cout<<endl<<red_text("勇者擊敗了惡龍!");
        this_thread::sleep_for(chrono::milliseconds(300));
        cout<<endl;
        pause();
        exit(0);
    }
}